

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaF_close(lua_State *L,StkId level)

{
  byte bVar1;
  global_State *pgVar2;
  TValue *pTVar3;
  global_State *pgVar4;
  GCObject *o;
  byte bVar5;
  GCObject *uv;
  
  uv = L->openupval;
  if (uv != (GCObject *)0x0) {
    pgVar2 = L->l_G;
    do {
      if ((uv->h).metatable < level) {
        return;
      }
      L->openupval = (uv->gch).next;
      if ((~pgVar2->currentwhite & (uv->gch).marked & 3) == 0) {
        ((uv->th).l_G)->ud =
             (void *)(((anon_union_16_2_e895e9e6_for_u *)&(uv->h).array)->value).value;
        (((((anon_union_16_2_e895e9e6_for_u *)&(uv->h).array)->l).prev)->u).l.next =
             (UpVal *)(uv->h).node;
        pTVar3 = (uv->p).k;
        (((anon_union_16_2_e895e9e6_for_u *)&(uv->h).array)->value).value = pTVar3->value;
        *(int *)&(uv->h).node = pTVar3->tt;
        (uv->h).metatable = (Table *)&(uv->h).array;
        pgVar4 = L->l_G;
        (uv->gch).next = pgVar4->rootgc;
        pgVar4->rootgc = uv;
        bVar1 = (uv->gch).marked;
        if ((bVar1 & 7) == 0) {
          if (pgVar4->gcstate == '\x01') {
            (uv->gch).marked = bVar1 | 4;
            if ((3 < *(int *)&(uv->h).node) &&
               (o = (GCObject *)(((anon_union_16_2_e895e9e6_for_u *)&(uv->h).array)->l).prev,
               ((o->gch).marked & 3) != 0)) {
              pgVar4 = L->l_G;
              if (pgVar4->gcstate != '\x01') {
                bVar5 = pgVar4->currentwhite;
                goto LAB_00104457;
              }
              reallymarkobject(pgVar4,o);
            }
          }
          else {
            bVar5 = pgVar4->currentwhite;
LAB_00104457:
            (uv->gch).marked = bVar5 & 3 | bVar1;
          }
        }
      }
      else {
        luaF_freeupval(L,&uv->uv);
      }
      uv = L->openupval;
    } while (uv != (GCObject *)0x0);
  }
  return;
}

Assistant:

static void luaF_close(lua_State*L,StkId level){
UpVal*uv;
global_State*g=G(L);
while(L->openupval!=NULL&&(uv=ngcotouv(L->openupval))->v>=level){
GCObject*o=obj2gco(uv);
L->openupval=uv->next;
if(isdead(g,o))
luaF_freeupval(L,uv);
else{
unlinkupval(uv);
setobj(L,&uv->u.value,uv->v);
uv->v=&uv->u.value;
luaC_linkupval(L,uv);
}
}
}